

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcTimeSeriesSchedule::IfcTimeSeriesSchedule(IfcTimeSeriesSchedule *this)

{
  IfcTimeSeriesSchedule *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x138,"IfcTimeSeriesSchedule");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00e314f0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTimeSeriesSchedule,_3UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTimeSeriesSchedule,_3UL>,
             &PTR_construction_vtable_24__00e315a0);
  *(undefined8 *)this = 0xe31410;
  *(undefined8 *)&this->field_0x138 = 0xe314d8;
  *(undefined8 *)&this->field_0x88 = 0xe31438;
  *(undefined8 *)&this->field_0x98 = 0xe31460;
  *(undefined8 *)&this->field_0xd0 = 0xe31488;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTimeSeriesSchedule,_3UL>)._vptr_ObjectHelper
       = (_func_int **)0xe314b0;
  STEP::Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL>_>::Maybe
            ((Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL>_> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTimeSeriesSchedule,_3UL>).
              field_0x10);
  std::__cxx11::string::string((string *)&this->TimeSeriesScheduleType);
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy(&this->TimeSeries,(LazyObject *)0x0);
  return;
}

Assistant:

IfcTimeSeriesSchedule() : Object("IfcTimeSeriesSchedule") {}